

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

QString * __thiscall
MakefileGenerator::valGlue
          (QString *__return_storage_ptr__,MakefileGenerator *this,ProStringList *varList,
          QString *before,QString *glue,QString *after)

{
  long lVar1;
  ProString *pPVar2;
  ProString *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&> local_90;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  lVar1 = (varList->super_QList<ProString>).d.size;
  if (lVar1 != 0) {
    pPVar2 = (varList->super_QList<ProString>).d.ptr;
    this_00 = pPVar2;
    do {
      if (this_00->m_length != 0) {
        if (local_78.d.size != 0) {
          QString::append((QString *)&local_78);
        }
        ProString::toQString(&local_58,this_00);
        QString::append((QString *)&local_78);
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        pPVar2 = (varList->super_QList<ProString>).d.ptr;
        lVar1 = (varList->super_QList<ProString>).d.size;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pPVar2 + lVar1);
    if (local_78.d.size != 0) {
      local_90.a.a = before;
      local_90.a.b = &local_78;
      local_90.b = after;
      QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&>::
      convertTo<QString>(__return_storage_ptr__,&local_90);
      goto LAB_0016cd00;
    }
  }
  QVar3.m_data = (storage_type *)0x0;
  QVar3.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar3);
  (__return_storage_ptr__->d).d = local_58.d.d;
  (__return_storage_ptr__->d).ptr = local_58.d.ptr;
  (__return_storage_ptr__->d).size = local_58.d.size;
LAB_0016cd00:
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
MakefileGenerator::valGlue(const ProStringList &varList, const QString &before, const QString &glue, const QString &after) const
{
    QString ret;
    for (ProStringList::ConstIterator it = varList.begin(); it != varList.end(); ++it) {
        if (!(*it).isEmpty()) {
            if (!ret.isEmpty())
                ret += glue;
            ret += (*it).toQString();
        }
    }
    return ret.isEmpty() ? QString("") : before + ret + after;
}